

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O0

GenericUnion * __thiscall avro::GenericUnion::operator=(GenericUnion *this,GenericUnion *param_2)

{
  GenericDatum *in_RSI;
  GenericUnion *in_RDI;
  
  GenericContainer::operator=((GenericContainer *)in_RSI,&in_RDI->super_GenericContainer);
  in_RDI->curBranch_ = *(size_t *)(in_RSI + 1);
  GenericDatum::operator=(in_RSI,(GenericDatum *)in_RDI);
  return in_RDI;
}

Assistant:

class AVRO_DECL GenericUnion : public GenericContainer {
    size_t curBranch_;
    GenericDatum datum_;

public:
    /**
     * Constructs a generic union corresponding to the given schema \p schema,
     * and the given value. The schema should be of Avro type union
     * and the value should correspond to one of the branches of the union.
     */
    GenericUnion(const NodePtr& schema) :
        GenericContainer(AVRO_UNION, schema), curBranch_(schema->leaves()) {
    }

    /**
     * Returns the index of the current branch.
     */
    size_t currentBranch() const { return curBranch_; }

    /**
     * Selects a new branch. The type for the value is changed accordingly.
     * \param branch The index for the selected branch.
     */
    void selectBranch(size_t branch) {
        if (curBranch_ != branch) {
            datum_ = GenericDatum(schema()->leafAt(branch));
            curBranch_ = branch;
        }
    }

    /**
     * Returns the datum corresponding to the currently selected branch
     * in this union.
     */
    GenericDatum& datum() {
        return datum_;
    }

    /**
     * Returns the datum corresponding to the currently selected branch
     * in this union.
     */
    const GenericDatum& datum() const {
        return datum_;
    }
}